

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O1

bool __thiscall tinyusdz::Prim::add_child(Prim *this,Prim *rhs,bool rename_prim_name,string *err)

{
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  Prim *__args;
  bool bVar4;
  size_type sVar5;
  char *pcVar6;
  char *pcVar7;
  string *in;
  pointer pPVar8;
  ulong uVar9;
  long lVar10;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar11;
  string elementName;
  string unique_name;
  _Alloc_node __an;
  key_type local_170;
  string local_150;
  string local_130;
  Path *local_110;
  Prim *local_108;
  Path local_100;
  
  local_110 = &rhs->_elementPath;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  pcVar3 = (rhs->_elementPath)._prim_part._M_dataplus._M_p;
  pcVar6 = (char *)err;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,pcVar3,pcVar3 + (rhs->_elementPath)._prim_part._M_string_length);
  if (local_170._M_string_length == 0) {
    if (rename_prim_name) {
      pcVar6 = "default";
      std::__cxx11::string::_M_replace((ulong)&local_170,0,(char *)0x0,0x1d6611);
      bVar4 = SetPrimElementName(&rhs->_data,&local_170);
      if (bVar4) {
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
        Path::Path(&local_100,&local_170,&local_150);
        Path::operator=(local_110,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._element._M_dataplus._M_p != &local_100._element.field_2) {
          operator_delete(local_100._element._M_dataplus._M_p,
                          local_100._element.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._variant_part_str._M_dataplus._M_p != &local_100._variant_part_str.field_2)
        {
          operator_delete(local_100._variant_part_str._M_dataplus._M_p,
                          local_100._variant_part_str.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._variant_selection_part._M_dataplus._M_p !=
            &local_100._variant_selection_part.field_2) {
          operator_delete(local_100._variant_selection_part._M_dataplus._M_p,
                          local_100._variant_selection_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._variant_part._M_dataplus._M_p != &local_100._variant_part.field_2) {
          operator_delete(local_100._variant_part._M_dataplus._M_p,
                          local_100._variant_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._prop_part._M_dataplus._M_p != &local_100._prop_part.field_2) {
          operator_delete(local_100._prop_part._M_dataplus._M_p,
                          local_100._prop_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._prim_part._M_dataplus._M_p != &local_100._prim_part.field_2) {
          operator_delete(local_100._prim_part._M_dataplus._M_p,
                          local_100._prim_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,
                          CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                   local_150.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_00128fd1;
      }
      if (err == (string *)0x0) goto LAB_001296bb;
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_150,"Internal error. cannot modify Prim\'s elementName.\n","");
      fmt::format(&local_100._prim_part,&local_150);
      std::__cxx11::string::operator=((string *)err,(string *)&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._prim_part._M_dataplus._M_p != &local_100._prim_part.field_2)
      goto LAB_001294fd;
LAB_0012950d:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
LAB_001296ae:
        operator_delete(local_150._M_dataplus._M_p,
                        CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                 local_150.field_2._M_local_buf[0]) + 1);
      }
    }
    else if (err != (string *)0x0) {
      bVar4 = false;
      std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,0x1d664c);
      goto LAB_001296bd;
    }
  }
  else {
LAB_00128fd1:
    this_00 = &this->_childrenNameSet;
    local_108 = rhs;
    if (((long)(this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
               ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x21cfb2b78c13521d -
        (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(&this_00->_M_t,
                 (_Link_type)
                 (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      p_Var1 = &(this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header;
      pcVar6 = (char *)0x0;
      (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pPVar8 = (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
          _M_impl.super__Vector_impl_data._M_finish != pPVar8) {
        lVar10 = 0x1a0;
        uVar9 = 0;
        do {
          if (*(long *)((long)&(pPVar8->_abs_path)._prim_part._M_string_length + lVar10) == 0) {
            if (err == (string *)0x0) goto LAB_0012960b;
            pcVar6 = (char *)err->_M_string_length;
            pcVar7 = "Internal error: Existing child Prim\'s elementName is empty.\n";
LAB_00129602:
            bVar4 = false;
            std::__cxx11::string::_M_replace((ulong)err,0,pcVar6,(ulong)pcVar7);
            goto LAB_001296bd;
          }
          sVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&this_00->_M_t,
                          (key_type *)
                          ((long)&(pPVar8->_abs_path)._prim_part._M_dataplus._M_p + lVar10));
          if (sVar5 != 0) {
            if (err != (string *)0x0) {
              pcVar6 = (char *)err->_M_string_length;
              pcVar7 = "Internal error: _children contains Prim with same elementName.\n";
              goto LAB_00129602;
            }
            goto LAB_0012960b;
          }
          pcVar6 = (char *)((long)&(((this->_children).
                                     super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_abs_path).
                                   _prim_part._M_dataplus + lVar10);
          pVar11 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::_M_get_insert_equal_pos(&this_00->_M_t,(key_type *)pcVar6);
          local_100._prim_part._M_dataplus._M_p = (pointer)this_00;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::
          _M_insert_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this_00,pVar11.first,pVar11.second,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar6,
                     (_Alloc_node *)&local_100);
          uVar9 = uVar9 + 1;
          pPVar8 = (this->_children).
                   super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar10 = lVar10 + 0x350;
        } while (uVar9 < (ulong)(((long)(this->_children).
                                        super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar8 >>
                                 4) * 0x21cfb2b78c13521d));
      }
    }
    sVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this_00->_M_t,&local_170);
    __args = local_108;
    if (sVar5 == 0) {
LAB_001292b3:
      pVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::_M_get_insert_equal_pos(&this_00->_M_t,&local_170);
      local_100._prim_part._M_dataplus._M_p = (pointer)this_00;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      _M_insert_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this_00,pVar11.first,pVar11.second,&local_170,(_Alloc_node *)&local_100);
      std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
                (&this->_children,__args);
      this->_child_dirty = true;
      bVar4 = true;
      goto LAB_001296bd;
    }
    if (!rename_prim_name) {
      if (err == (string *)0x0) {
LAB_0012960b:
        bVar4 = false;
        goto LAB_001296bd;
      }
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_150,"Prim name(elementName) {} already exists in children.\n","");
      fmt::format<std::__cxx11::string>
                (&local_100._prim_part,(fmt *)&local_150,&local_110->_prim_part,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar6);
      std::__cxx11::string::operator=((string *)err,(string *)&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._prim_part._M_dataplus._M_p != &local_100._prim_part.field_2) {
LAB_001294fd:
        operator_delete(local_100._prim_part._M_dataplus._M_p,
                        local_100._prim_part.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0012950d;
    }
    paVar2 = &local_150.field_2;
    local_150._M_string_length = 0;
    local_150.field_2._M_local_buf[0] = '\0';
    local_150._M_dataplus._M_p = (pointer)paVar2;
    bVar4 = makeUniqueName(this_00,&local_170,&local_150);
    if (bVar4) {
      bVar4 = ValidatePrimElementName(&local_150);
      if (bVar4) {
        std::__cxx11::string::_M_assign((string *)&local_170);
        bVar4 = SetPrimElementName(&__args->_data,&local_170);
        if (bVar4) {
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
          Path::Path(&local_100,&local_170,&local_130);
          Path::operator=(local_110,&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._element._M_dataplus._M_p != &local_100._element.field_2) {
            operator_delete(local_100._element._M_dataplus._M_p,
                            local_100._element.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._variant_part_str._M_dataplus._M_p !=
              &local_100._variant_part_str.field_2) {
            operator_delete(local_100._variant_part_str._M_dataplus._M_p,
                            local_100._variant_part_str.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._variant_selection_part._M_dataplus._M_p !=
              &local_100._variant_selection_part.field_2) {
            operator_delete(local_100._variant_selection_part._M_dataplus._M_p,
                            local_100._variant_selection_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._variant_part._M_dataplus._M_p != &local_100._variant_part.field_2) {
            operator_delete(local_100._variant_part._M_dataplus._M_p,
                            local_100._variant_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._prop_part._M_dataplus._M_p != &local_100._prop_part.field_2) {
            operator_delete(local_100._prop_part._M_dataplus._M_p,
                            local_100._prop_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._prim_part._M_dataplus._M_p != &local_100._prim_part.field_2) {
            operator_delete(local_100._prim_part._M_dataplus._M_p,
                            local_100._prim_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != paVar2) {
            operator_delete(local_150._M_dataplus._M_p,
                            CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                     local_150.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_001292b3;
        }
        if (err == (string *)0x0) goto LAB_001296a4;
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,"Internal error. cannot modify Prim\'s elementName.\n","");
        fmt::format(&local_100._prim_part,&local_130);
LAB_00129662:
        std::__cxx11::string::operator=((string *)err,(string *)&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._prim_part._M_dataplus._M_p != &local_100._prim_part.field_2) {
          operator_delete(local_100._prim_part._M_dataplus._M_p,
                          local_100._prim_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
      }
      else if (err != (string *)0x0) {
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,
                   "Internally generated Prim name `{}` is invalid as a Prim name.\n","");
        in = &local_150;
        goto LAB_00129657;
      }
    }
    else if (err != (string *)0x0) {
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,"Internal error. cannot assign unique name for `{}`.\n","");
      in = &local_170;
LAB_00129657:
      fmt::format<std::__cxx11::string>
                (&local_100._prim_part,(fmt *)&local_130,in,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar6);
      goto LAB_00129662;
    }
LAB_001296a4:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar2) goto LAB_001296ae;
  }
LAB_001296bb:
  bVar4 = false;
LAB_001296bd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool Prim::add_child(Prim &&rhs, const bool rename_prim_name,
                     std::string *err) {
#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif

  std::string elementName = rhs.element_name();

  if (elementName.empty()) {
    if (rename_prim_name) {
      // assign default name `default`
      elementName = "default";

      if (!SetPrimElementName(rhs.get_data(), elementName)) {
        if (err) {
          (*err) = fmt::format(
              "Internal error. cannot modify Prim's elementName.\n");
        }
        return false;
      }
      rhs.element_path() = Path(elementName, /* prop_part */ "");
    } else {
      if (err) {
        (*err) = "Prim has empty elementName.\n";
      }
      return false;
    }
  }

  if (_children.size() != _childrenNameSet.size()) {
    // Rebuild _childrenNames
    _childrenNameSet.clear();
    for (size_t i = 0; i < _children.size(); i++) {
      if (_children[i].element_name().empty()) {
        if (err) {
          (*err) =
              "Internal error: Existing child Prim's elementName is empty.\n";
        }
        return false;
      }

      if (_childrenNameSet.count(_children[i].element_name())) {
        if (err) {
          (*err) =
              "Internal error: _children contains Prim with same "
              "elementName.\n";
        }
        return false;
      }

      _childrenNameSet.insert(_children[i].element_name());
    }
  }

  DCOUT("elementName = " << elementName);

  if (_childrenNameSet.count(elementName)) {
    if (rename_prim_name) {
      std::string unique_name;
      if (!makeUniqueName(_childrenNameSet, elementName, &unique_name)) {
        if (err) {
          (*err) = fmt::format(
              "Internal error. cannot assign unique name for `{}`.\n",
              elementName);
        }
        return false;
      }

      // Ensure valid Prim name
      if (!ValidatePrimElementName(unique_name)) {
        if (err) {
          (*err) = fmt::format(
              "Internally generated Prim name `{}` is invalid as a Prim "
              "name.\n",
              unique_name);
        }
        return false;
      }

      elementName = unique_name;

      // Need to modify both Prim::data::name and Prim::elementPath
      DCOUT("elementName = " << elementName);
      if (!SetPrimElementName(rhs.get_data(), elementName)) {
        if (err) {
          (*err) = fmt::format(
              "Internal error. cannot modify Prim's elementName.\n");
        }
        return false;
      }
      rhs.element_path() = Path(elementName, /* prop_part */ "");
    } else {
      if (err) {
        (*err) = fmt::format(
            "Prim name(elementName) {} already exists in children.\n",
            rhs.element_name());
      }
      return false;
    }
  }

  DCOUT("rhs.elementName = " << rhs.element_name());

  _childrenNameSet.insert(elementName);
  _children.emplace_back(std::move(rhs));
  _child_dirty = true;

  return true;
}